

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Human.cpp
# Opt level: O1

void __thiscall
Human::Human(Human *this,string *id,string *name,string *last_Name,string *phone_number,
            string *user_name,string *password,string *age)

{
  (this->Id)._M_dataplus._M_p = (pointer)&(this->Id).field_2;
  (this->Id)._M_string_length = 0;
  (this->Id).field_2._M_local_buf[0] = '\0';
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Last_Name)._M_dataplus._M_p = (pointer)&(this->Last_Name).field_2;
  (this->Last_Name)._M_string_length = 0;
  (this->Last_Name).field_2._M_local_buf[0] = '\0';
  (this->Phone_number)._M_dataplus._M_p = (pointer)&(this->Phone_number).field_2;
  (this->Phone_number)._M_string_length = 0;
  (this->Phone_number).field_2._M_local_buf[0] = '\0';
  (this->User_name)._M_dataplus._M_p = (pointer)&(this->User_name).field_2;
  (this->User_name)._M_string_length = 0;
  (this->User_name).field_2._M_local_buf[0] = '\0';
  (this->Password)._M_dataplus._M_p = (pointer)&(this->Password).field_2;
  (this->Password)._M_string_length = 0;
  (this->Password).field_2._M_local_buf[0] = '\0';
  (this->Age)._M_dataplus._M_p = (pointer)&(this->Age).field_2;
  (this->Age)._M_string_length = 0;
  (this->Age).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->Name);
  std::__cxx11::string::_M_assign((string *)&this->Last_Name);
  std::__cxx11::string::_M_assign((string *)&this->Phone_number);
  std::__cxx11::string::_M_assign((string *)&this->User_name);
  std::__cxx11::string::_M_assign((string *)&this->Password);
  std::__cxx11::string::_M_assign((string *)&this->Age);
  return;
}

Assistant:

Human :: Human(string id,string name,string last_Name,string phone_number,string user_name,string password,string age){
    Id = id;
    Name = name;
    Last_Name =last_Name;
    Phone_number =phone_number;
    User_name = user_name;
    Password = password;
    Age = age;

}